

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

string * string_trim(string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  string *local_38;
  
  uVar1 = input->_M_string_length;
  if (uVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_38 = __return_storage_ptr__;
  }
  else {
    pcVar2 = (input->_M_dataplus)._M_p;
    uVar5 = (ulong)((int)uVar1 + -1);
    uVar6 = 0;
    do {
      iVar3 = isspace((int)pcVar2[uVar6]);
      if (((long)uVar5 <= (long)uVar6) || (iVar3 == 0)) goto joined_r0x00115213;
      uVar6 = uVar6 + 1;
      uVar4 = uVar1;
    } while (uVar1 != uVar6);
LAB_0011525b:
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar1);
LAB_00115265:
    std::__cxx11::string::substr((ulong)local_38,(ulong)input);
  }
  return local_38;
joined_r0x00115213:
  uVar4 = uVar5;
  local_38 = __return_storage_ptr__;
  if (uVar1 <= uVar5) goto LAB_0011525b;
  iVar3 = isspace((int)pcVar2[uVar5]);
  if (((long)uVar5 <= (long)uVar6) || (iVar3 == 0)) goto LAB_00115265;
  uVar5 = uVar5 - 1;
  goto joined_r0x00115213;
}

Assistant:

inline std::string string_trim(const std::string &input)
{
    if (input.size() < 1)
        return std::string();
    int first = 0, last = input.size() - 1;
    while (std::isspace(input.at(first)) && first < last) ++first;
    while (std::isspace(input.at(last)) && first < last) --last;
    return input.substr(first, last+1);
}